

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_font_atlas_end(nk_font_atlas *atlas,nk_handle texture,nk_draw_null_texture *null)

{
  undefined4 uVar1;
  nk_recti nVar2;
  undefined4 uVar3;
  undefined1 auVar4 [12];
  nk_font *pnVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  undefined1 auVar8 [16];
  long lVar12;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x35b7,
                  "void nk_font_atlas_end(struct nk_font_atlas *, nk_handle, struct nk_draw_null_texture *)"
                 );
  }
  if (null != (nk_draw_null_texture *)0x0) {
    null->texture = texture;
    nVar2 = atlas->custom;
    auVar8._8_4_ = 0;
    auVar8._0_2_ = nVar2.x;
    auVar8._2_2_ = nVar2.y;
    auVar8._4_2_ = nVar2.w;
    auVar8._6_2_ = nVar2.h;
    auVar8._12_2_ = nVar2.h;
    auVar8._14_2_ = nVar2.h;
    auVar7._12_4_ = auVar8._12_4_;
    auVar7._8_2_ = 0;
    auVar7._0_2_ = nVar2.x;
    auVar7._2_2_ = nVar2.y;
    auVar7._4_2_ = nVar2.w;
    auVar7._6_2_ = nVar2.h;
    auVar7._10_2_ = nVar2.w;
    auVar10._10_6_ = auVar7._10_6_;
    auVar10._8_2_ = nVar2.w;
    auVar10._0_2_ = nVar2.x;
    auVar10._2_2_ = nVar2.y;
    auVar10._4_2_ = nVar2.w;
    auVar10._6_2_ = nVar2.h;
    auVar4._4_8_ = auVar10._8_8_;
    auVar4._2_2_ = nVar2.y;
    auVar4._0_2_ = nVar2.y;
    auVar9._0_4_ = (float)(int)nVar2.x + 0.5;
    auVar9._4_4_ = (float)(auVar4._0_4_ >> 0x10) + 0.5;
    auVar9._8_4_ = (float)(auVar10._8_4_ >> 0x10) + 0.0;
    auVar9._12_4_ = (float)(auVar7._12_4_ >> 0x10) + 0.0;
    uVar1 = atlas->tex_width;
    uVar3 = atlas->tex_height;
    auVar13._0_4_ = (float)(int)uVar1;
    auVar13._4_4_ = (float)(int)uVar3;
    auVar13._8_8_ = 0;
    auVar10 = divps(auVar9,auVar13);
    null->uv = auVar10._0_8_;
  }
  for (pnVar5 = atlas->fonts; auVar10 = _DAT_00160090, pnVar5 != (nk_font *)0x0;
      pnVar5 = pnVar5->next) {
    pnVar5->texture = texture;
    (pnVar5->handle).texture = texture;
  }
  lVar6 = 0x70;
  iVar14 = (int)DAT_00160330;
  iVar15 = DAT_00160330._4_4_;
  auVar11 = _DAT_001600b0;
  do {
    if (SUB164(auVar11 ^ auVar10,4) == iVar15 && SUB164(auVar11 ^ auVar10,0) < iVar14) {
      *(nk_handle *)((long)atlas->cursors[0].img.region + lVar6 + -0x7c) = texture;
      *(nk_handle *)((long)(&atlas->cursors[0].img + -3) + lVar6) = texture;
    }
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 2;
    auVar11._8_8_ = lVar12 + 2;
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0x1b0);
  (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
  atlas->pixel = (void *)0x0;
  atlas->tex_width = 0;
  atlas->tex_height = 0;
  (atlas->custom).x = 0;
  (atlas->custom).y = 0;
  (atlas->custom).w = 0;
  (atlas->custom).h = 0;
  return;
}

Assistant:

NK_API void
nk_font_atlas_end(struct nk_font_atlas *atlas, nk_handle texture,
    struct nk_draw_null_texture *null)
{
    int i = 0;
    struct nk_font *font_iter;
    NK_ASSERT(atlas);
    if (!atlas) {
        if (!null) return;
        null->texture = texture;
        null->uv = nk_vec2(0.5f,0.5f);
    }
    if (null) {
        null->texture = texture;
        null->uv.x = (atlas->custom.x + 0.5f)/(float)atlas->tex_width;
        null->uv.y = (atlas->custom.y + 0.5f)/(float)atlas->tex_height;
    }
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        font_iter->texture = texture;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
        font_iter->handle.texture = texture;
#endif
    }
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        atlas->cursors[i].img.handle = texture;

    atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
    atlas->pixel = 0;
    atlas->tex_width = 0;
    atlas->tex_height = 0;
    atlas->custom.x = 0;
    atlas->custom.y = 0;
    atlas->custom.w = 0;
    atlas->custom.h = 0;
}